

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  void *pvVar6;
  double dVar7;
  Employee *local_1718;
  Boss local_1550;
  undefined1 local_1490 [8];
  Company c;
  Employee local_1468;
  Employee local_13b0;
  Employee local_12f8;
  Employee local_1240;
  Employee local_1188;
  Employee local_10d0;
  Employee local_1018;
  Employee local_f60;
  Employee local_ea8;
  Employee local_df0;
  undefined1 auStack_d38 [16];
  string local_d28;
  allocator local_d01;
  string local_d00;
  undefined1 local_ce0 [8];
  Boss b;
  string local_c18;
  allocator local_bf1;
  string local_bf0;
  undefined1 local_bd0 [8];
  Employee e10;
  string local_b10;
  allocator local_ae9;
  string local_ae8;
  undefined1 local_ac8 [8];
  Employee e9;
  string local_a08;
  allocator local_9e1;
  string local_9e0;
  undefined1 local_9c0 [8];
  Employee e8;
  string local_900;
  allocator local_8d9;
  string local_8d8;
  undefined1 local_8b8 [8];
  Employee e7;
  string local_7f8;
  allocator local_7d1;
  string local_7d0;
  undefined1 local_7b0 [8];
  Employee e6;
  string local_6f0;
  allocator local_6c9;
  string local_6c8;
  undefined1 local_6a8 [8];
  Employee e5;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  undefined1 local_5a0 [8];
  Employee e4;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  undefined1 local_498 [8];
  Employee e3;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  undefined1 local_390 [8];
  Employee e2;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  undefined1 local_288 [8];
  Employee e1;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  undefined1 local_158 [8];
  Address a1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_91;
  string local_90;
  undefined1 local_70 [8];
  Address a;
  
  a.street.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"iran",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"babol",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f0,"meraj",(allocator *)(a1.street.field_2._M_local_buf + 0xf));
  Address::Address((Address *)local_70,&local_90,&local_c8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)(a1.street.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"iran",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"tehran",&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"valiasr",(allocator *)((long)&e1.workDone + 3))
  ;
  Address::Address((Address *)local_158,&local_178,&local_1a0,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e1.workDone + 3));
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"s",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2d0,"99*ab11789",(allocator *)((long)&e2.workDone + 3));
  Employee::Employee((Employee *)local_288,&local_2a8,&local_2d0,(Address *)local_70,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e2.workDone + 3));
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b0,"d",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3d8,"87*ab11789",(allocator *)((long)&e3.workDone + 3));
  Employee::Employee((Employee *)local_390,&local_3b0,&local_3d8,(Address *)local_158,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e3.workDone + 3));
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"f",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e0,"91*ab11789",(allocator *)((long)&e4.workDone + 3));
  Employee::Employee((Employee *)local_498,&local_4b8,&local_4e0,(Address *)local_70,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e4.workDone + 3));
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c0,"g",&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5e8,"97*ab23789",(allocator *)((long)&e5.workDone + 3));
  Employee::Employee((Employee *)local_5a0,&local_5c0,&local_5e8,(Address *)local_70,2,10,4,3);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e5.workDone + 3));
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c8,"j",&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6f0,"91*sd11789",(allocator *)((long)&e6.workDone + 3));
  Employee::Employee((Employee *)local_6a8,&local_6c8,&local_6f0,(Address *)local_70,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e6.workDone + 3));
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7d0,"r",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7f8,"91*a11789",(allocator *)((long)&e7.workDone + 3));
  Employee::Employee((Employee *)local_7b0,&local_7d0,&local_7f8,(Address *)local_70,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e7.workDone + 3));
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d8,"k",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_900,"95*we01789",(allocator *)((long)&e8.workDone + 3));
  Employee::Employee((Employee *)local_8b8,&local_8d8,&local_900,(Address *)local_70,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e8.workDone + 3));
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9e0,"a",&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a08,"94*ab11989",(allocator *)((long)&e9.workDone + 3));
  Employee::Employee((Employee *)local_9c0,&local_9e0,&local_a08,(Address *)local_70,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e9.workDone + 3));
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ae8,"c",&local_ae9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b10,"89*ab11189",(allocator *)((long)&e10.workDone + 3));
  Employee::Employee((Employee *)local_ac8,&local_ae8,&local_b10,(Address *)local_70,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e10.workDone + 3));
  std::__cxx11::string::~string((string *)&local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bf0,"x",&local_bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c18,"86*a11789",(allocator *)&b.field_0xbf);
  Employee::Employee((Employee *)local_bd0,&local_bf0,&local_c18,(Address *)local_158,2,10,4,2);
  std::__cxx11::string::~string((string *)&local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&b.field_0xbf);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d00,"sam",&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d28,"89*ab11789",(allocator *)(auStack_d38 + 0xf));
  Boss::Boss((Boss *)local_ce0,&local_d00,&local_d28,(Address *)local_70,2,10,4,2,10);
  std::__cxx11::string::~string((string *)&local_d28);
  std::allocator<char>::~allocator((allocator<char> *)(auStack_d38 + 0xf));
  std::__cxx11::string::~string((string *)&local_d00);
  std::allocator<char>::~allocator((allocator<char> *)&local_d01);
  c.employee = (Employee **)&local_1468;
  Employee::Employee((Employee *)c.employee,(Employee *)local_288);
  c.employee = (Employee **)&local_13b0;
  Employee::Employee((Employee *)c.employee,(Employee *)local_390);
  c.employee = (Employee **)&local_12f8;
  Employee::Employee((Employee *)c.employee,(Employee *)local_498);
  c.employee = (Employee **)&local_1240;
  Employee::Employee((Employee *)c.employee,(Employee *)local_5a0);
  c.employee = (Employee **)&local_1188;
  Employee::Employee((Employee *)c.employee,(Employee *)local_6a8);
  c.employee = (Employee **)&local_10d0;
  Employee::Employee((Employee *)c.employee,(Employee *)local_7b0);
  c.employee = (Employee **)&local_1018;
  Employee::Employee((Employee *)c.employee,(Employee *)local_8b8);
  c.employee = (Employee **)&local_f60;
  Employee::Employee((Employee *)c.employee,(Employee *)local_9c0);
  c.employee = (Employee **)&local_ea8;
  Employee::Employee((Employee *)c.employee,(Employee *)local_ac8);
  c.employee = (Employee **)&local_df0;
  Employee::Employee((Employee *)c.employee,(Employee *)local_bd0);
  poVar3 = std::operator<<((ostream *)&std::cout,'e');
  psVar4 = Person::getId_abi_cxx11_((Person *)local_288);
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
  std::operator<<(poVar3,*pcVar5);
  Boss::Boss(&local_1550,(Boss *)local_ce0);
  Company::Company((Company *)local_1490,0x315,&local_1550,&local_1468);
  Boss::~Boss(&local_1550);
  iVar2 = Company::getBudget((Company *)local_1490);
  pvVar6 = (void *)std::ostream::operator<<(&std::cout,iVar2);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  Company::setBudget((Company *)local_1490,0x381);
  iVar2 = Company::getBudget((Company *)local_1490);
  pvVar6 = (void *)std::ostream::operator<<(&std::cout,iVar2);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  dVar7 = Company::averageEfficiency((Company *)local_1490);
  pvVar6 = (void *)std::ostream::operator<<(&std::cout,dVar7);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  Company::gift((Company *)local_1490);
  iVar2 = Employee::getHourWork(&local_13b0);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  poVar3 = std::operator<<(poVar3,"\t");
  iVar2 = Employee::getHourWork(&local_df0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"\t");
  iVar2 = Employee::getHourWork(&local_1240);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"\t");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Company::payForService((Company *)local_1490);
  iVar2 = Employee::getHourWork(&local_13b0);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  poVar3 = std::operator<<(poVar3,"\t");
  iVar2 = Employee::getHourWork(&local_df0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"\t");
  iVar2 = Employee::getHourWork(&local_1240);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"\t");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar6 = (void *)std::ostream::operator<<(&std::cout,std::boolalpha);
  bVar1 = Company::isEnoughBudget((Company *)local_1490);
  std::ostream::operator<<(pvVar6,bVar1);
  a.street.field_2._12_4_ = 0;
  Company::~Company((Company *)local_1490);
  local_1718 = (Employee *)auStack_d38;
  do {
    local_1718 = local_1718 + -1;
    Employee::~Employee(local_1718);
  } while (local_1718 != &local_1468);
  Boss::~Boss((Boss *)local_ce0);
  Employee::~Employee((Employee *)local_bd0);
  Employee::~Employee((Employee *)local_ac8);
  Employee::~Employee((Employee *)local_9c0);
  Employee::~Employee((Employee *)local_8b8);
  Employee::~Employee((Employee *)local_7b0);
  Employee::~Employee((Employee *)local_6a8);
  Employee::~Employee((Employee *)local_5a0);
  Employee::~Employee((Employee *)local_498);
  Employee::~Employee((Employee *)local_390);
  Employee::~Employee((Employee *)local_288);
  Address::~Address((Address *)local_158);
  Address::~Address((Address *)local_70);
  return a.street.field_2._12_4_;
}

Assistant:

int main() {

    /*
    Address a0("", "", "");
    cin >> a0;
    cout << a0 << endl;
    Person p0("e", "91qef12389", a0);
    cin >> p0;
    cout << p0 << endl;
    p0.setName("ali");
    cout << p0.getName() << endl;
    Employee e0("sma", "98*ab11789", a0, 8,30,4,1);
    cout << e0.calculateSalary() << endl;
    cout << e0.efficiency() << endl;
    cout << e0;
     */
    //and ... (other functions & ...)

    //Company build
    Address a("iran", "babol", "meraj");
    Address a1("iran", "tehran", "valiasr");
    Employee e1("s", "99*ab11789", a, 2,10,4,2);
    Employee e2("d", "87*ab11789", a1, 2,10,4,2);
    Employee e3("f", "91*ab11789", a, 2,10,4,2);
    Employee e4("g", "97*ab23789", a, 2,10,4,3);
    Employee e5("j", "91*sd11789", a, 2,10,4,2);
    Employee e6("r", "91*a11789", a, 2,10,4,2);
    Employee e7("k", "95*we01789", a, 2,10,4,2);
    Employee e8("a", "94*ab11989", a, 2,10,4,2);
    Employee e9("c", "89*ab11189", a, 2,10,4,2);
    Employee e10("x", "86*a11789", a1, 2,10,4,2);
    Boss b("sam", "89*ab11789", a, 2,10,4,2,10);
    Employee e[] = {e1, e2, e3, e4, e5, e6, e7, e8, e9, e10};
    cout << 'e' << e1.getId()[0];
    Company c(789,b,e);
    cout << c.getBudget() << endl;
    c.setBudget(897);
    cout << c.getBudget() << endl;
//    cout << c.maxEfficiency() << endl;
    cout << c.averageEfficiency() << endl;
    c.gift();
    cout << e[1].getHourWork() << "\t" << e[9].getHourWork() << "\t" << e[3].getHourWork() << "\t" << endl;
    c.payForService();
    cout << e[1].getHourWork() << "\t" << e[9].getHourWork() << "\t" << e[3].getHourWork() << "\t" << endl;
    cout << boolalpha << c.isEnoughBudget();



    return 0;
}